

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ImDrawVert *pIVar4;
  long lVar5;
  float fVar6;
  long lVar7;
  ImDrawIdx *pIVar8;
  ulong uVar9;
  ImDrawIdx IVar10;
  int iVar11;
  ulong uVar12;
  ImU32 IVar13;
  int iVar14;
  ImVec2 *pIVar15;
  ImVec2 IVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ImDrawIdx IVar21;
  long lVar22;
  float fVar23;
  ImVec2 IVar24;
  ImVec2 IVar25;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong local_80;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  ulong local_68;
  ulong local_60;
  uint local_58;
  uint local_54;
  ulong local_50;
  ImVec2 *local_48;
  ImVec2 local_40;
  ImU32 local_34;
  
  if (2 < points_count) {
    uVar18 = (ulong)(uint)points_count;
    local_40 = this->_Data->TexUvWhitePixel;
    local_48 = points;
    local_34 = col;
    if ((this->Flags & 2) == 0) {
      uStack_90 = 0x134166;
      PrimReserve(this,points_count * 3 + -6,points_count);
      uVar12 = 0;
      do {
        this->_VtxWritePtr->pos = local_48[uVar12];
        this->_VtxWritePtr->uv = local_40;
        pIVar4 = this->_VtxWritePtr;
        pIVar4->col = local_34;
        this->_VtxWritePtr = pIVar4 + 1;
        uVar12 = uVar12 + 1;
      } while (uVar18 != uVar12);
      uVar3 = this->_VtxCurrentIdx;
      iVar11 = 3;
      if (3 < points_count) {
        iVar11 = points_count;
      }
      pIVar8 = this->_IdxWritePtr;
      iVar11 = iVar11 + -2;
      iVar14 = uVar3 + 2;
      do {
        *pIVar8 = (ImDrawIdx)uVar3;
        pIVar8[1] = (ImDrawIdx)iVar14 - 1;
        pIVar8[2] = (ImDrawIdx)iVar14;
        pIVar8 = pIVar8 + 3;
        iVar14 = iVar14 + 1;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      this->_IdxWritePtr = pIVar8;
      local_54 = points_count & 0xffff;
      local_88 = &this->_VtxCurrentIdx;
    }
    else {
      local_58 = col & 0xffffff;
      local_54 = points_count * 2;
      uStack_90 = 0x134204;
      PrimReserve(this,points_count * 9 + -6,local_54);
      local_88 = &this->_VtxCurrentIdx;
      uVar3 = this->_VtxCurrentIdx;
      uVar12 = (ulong)uVar3;
      uVar17 = (ulong)(uVar3 + 1);
      pIVar8 = this->_IdxWritePtr;
      iVar11 = points_count + -2;
      iVar14 = uVar3 + 2;
      do {
        *pIVar8 = (ImDrawIdx)uVar3;
        pIVar8[1] = (ImDrawIdx)iVar14;
        iVar14 = iVar14 + 2;
        pIVar8[2] = (ImDrawIdx)iVar14;
        pIVar8 = pIVar8 + 3;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      this->_IdxWritePtr = pIVar8;
      lVar5 = -(uVar18 * 8 + 0xf & 0xfffffffffffffff0);
      lVar7 = lVar5 + -0x88;
      uVar19 = (ulong)(points_count - 1);
      local_80 = uVar18;
      uVar18 = 1;
      if (1 < points_count) {
        uVar18 = (ulong)(uint)points_count;
      }
      uVar20 = 0;
      local_68 = uVar12;
      local_60 = uVar17;
      uVar9 = uVar19;
      pIVar15 = local_48;
      IVar16 = local_40;
      IVar13 = local_34;
      local_50 = uVar18;
      do {
        lVar22 = (long)(int)uVar9;
        local_78 = pIVar15[uVar20].x - pIVar15[lVar22].x;
        fStack_74 = pIVar15[uVar20].y - pIVar15[lVar22].y;
        fVar23 = local_78 * local_78 + fStack_74 * fStack_74;
        if (0.0 < fVar23) {
          if (fVar23 < 0.0) {
            uStack_70 = 0;
            *(undefined8 *)((long)&uStack_90 + lVar5) = 0x1342d5;
            fVar23 = sqrtf(fVar23);
            pIVar15 = local_48;
            IVar16 = local_40;
            uVar12 = local_68;
            uVar17 = local_60;
            uVar18 = local_50;
            IVar13 = local_34;
          }
          else {
            fVar23 = SQRT(fVar23);
          }
          local_78 = local_78 * (1.0 / fVar23);
          fStack_74 = fStack_74 * (1.0 / fVar23);
        }
        *(float *)((long)&local_88 + lVar22 * 8 + lVar7 + 0x88) = fStack_74;
        *(float *)((long)&local_88 + lVar22 * 8 + lVar5 + 4) = -local_78;
        uVar9 = uVar20 & 0xffffffff;
        uVar20 = uVar20 + 1;
      } while (uVar18 != uVar20);
      uVar18 = 1;
      if (1 < (int)local_80) {
        uVar18 = local_80 & 0xffffffff;
      }
      uVar20 = 0;
      uVar9 = uVar12 & 0xffffffff;
      local_50 = uVar18;
      do {
        uVar1 = *(undefined8 *)((long)&local_88 + (long)(int)uVar19 * 8 + lVar7 + 0x88);
        uVar2 = *(undefined8 *)((long)&local_88 + uVar20 * 8 + lVar7 + 0x88);
        local_78 = ((float)uVar2 + (float)uVar1) * 0.5;
        fStack_74 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
        fVar23 = local_78 * local_78 + fStack_74 * fStack_74;
        if (1e-06 < fVar23) {
          if (fVar23 < 0.0) {
            uStack_70 = 0;
            *(undefined8 *)((long)&uStack_90 + lVar5) = 0x1343b2;
            fVar23 = sqrtf(fVar23);
            pIVar15 = local_48;
            IVar16 = local_40;
            uVar12 = local_68;
            uVar17 = local_60;
            uVar18 = local_50;
            IVar13 = local_34;
          }
          else {
            fVar23 = SQRT(fVar23);
          }
          fVar6 = 100.0;
          if (1.0 / fVar23 <= 100.0) {
            fVar6 = 1.0 / fVar23;
          }
          local_78 = local_78 * fVar6;
          fStack_74 = fStack_74 * fVar6;
        }
        pIVar4 = this->_VtxWritePtr;
        IVar24.x = pIVar15[uVar20].x - local_78 * 0.5;
        IVar24.y = pIVar15[uVar20].y - fStack_74 * 0.5;
        pIVar4->pos = IVar24;
        pIVar4->uv = IVar16;
        pIVar4 = this->_VtxWritePtr;
        pIVar4->col = IVar13;
        IVar25.x = pIVar15[uVar20].x + local_78 * 0.5;
        IVar25.y = pIVar15[uVar20].y + fStack_74 * 0.5;
        pIVar4[1].pos = IVar25;
        pIVar4[1].uv = IVar16;
        pIVar4 = this->_VtxWritePtr;
        pIVar4[1].col = local_58;
        this->_VtxWritePtr = pIVar4 + 2;
        pIVar8 = this->_IdxWritePtr;
        IVar21 = (ImDrawIdx)uVar9;
        *pIVar8 = IVar21;
        pIVar8[1] = (short)uVar12 + (short)uVar19 * 2;
        IVar10 = (short)uVar17 + (short)uVar19 * 2;
        pIVar8[2] = IVar10;
        pIVar8[3] = IVar10;
        pIVar8[4] = IVar21 + 1;
        pIVar8[5] = IVar21;
        this->_IdxWritePtr = pIVar8 + 6;
        uVar19 = uVar20 & 0xffffffff;
        uVar20 = uVar20 + 1;
        uVar9 = (ulong)((int)uVar9 + 2);
      } while (uVar18 != uVar20);
      local_54 = local_54 & 0xfffe;
    }
    *local_88 = *local_88 + local_54;
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2));
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_NORMALIZE2F_OVER_EPSILON_CLAMP(dm_x, dm_y, 0.000001f, 100.0f);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}